

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  string *psVar1;
  int iVar2;
  ulong uVar3;
  size_t new_size;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  int local_2c;
  int local_28;
  int local_24;
  int *piStack_20;
  int old_size;
  int *size_local;
  void **data_local;
  StringOutputStream *this_local;
  
  piStack_20 = size;
  size_local = (int *)data;
  data_local = (void **)this;
  local_24 = std::__cxx11::string::size();
  uVar6 = (ulong)local_24;
  uVar3 = std::__cxx11::string::capacity();
  if (uVar6 < uVar3) {
    psVar1 = this->target_;
    new_size = std::__cxx11::string::capacity();
    STLStringResizeUninitialized(psVar1,new_size);
  }
  else {
    psVar1 = this->target_;
    local_28 = local_24 << 1;
    local_2c = 0x10;
    piVar4 = std::max<int>(&local_28,&local_2c);
    STLStringResizeUninitialized(psVar1,(long)*piVar4);
  }
  pcVar5 = string_as_array(this->target_);
  *(char **)size_local = pcVar5 + local_24;
  iVar2 = std::__cxx11::string::size();
  *piStack_20 = iVar2 - local_24;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  int old_size = target_->size();

  // Grow the string.
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    STLStringResizeUninitialized(target_, target_->capacity());
  } else {
    // Size has reached capacity, so double the size.  Also make sure
    // that the new size is at least kMinimumSize.
    STLStringResizeUninitialized(
      target_,
      max(old_size * 2,
          kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.
  }

  *data = string_as_array(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}